

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qemu-thread-posix.c
# Opt level: O1

void * qemu_thread_join(QemuThread *thread)

{
  uint err;
  void *in_RAX;
  long extraout_RDX;
  char *pcVar1;
  ulong uVar2;
  void *ret;
  void *local_8;
  
  local_8 = in_RAX;
  err = pthread_join(thread->thread,&local_8);
  if (err == 0) {
    return local_8;
  }
  pcVar1 = "qemu_thread_join";
  uVar2 = (ulong)err;
  error_exit(err,"qemu_thread_join");
  if (extraout_RDX == 0) {
    printf("%s:%d code should not be reached",uVar2,(ulong)pcVar1 & 0xffffffff);
    abort();
  }
  printf("%s:%d assertion failed: %s",uVar2,(ulong)pcVar1 & 0xffffffff);
  abort();
}

Assistant:

void *qemu_thread_join(QemuThread *thread)
{
    int err;
    void *ret;

    err = pthread_join(thread->thread, &ret);
    if (err) {
        error_exit(err, __func__);
    }
    return ret;
}